

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRange.cxx
# Opt level: O1

int testRange(int param_1,char **param_2)

{
  byte *pbVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  vector<int,_std::allocator<int>_> testData;
  vector<int,_std::allocator<int>_> evenData;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringRange;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 local_c8 [32];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  byte local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  
  local_c8._16_8_ = (byte *)0x600000005;
  local_c8._24_8_ = (byte *)0x800000007;
  local_c8._0_8_ = (byte *)0x200000001;
  local_c8._8_8_ = (byte *)0x400000003;
  local_a8._M_current = (int *)0xa00000009;
  __l._M_len = 10;
  __l._M_array = (iterator)local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,(allocator_type *)&local_f8);
  piVar3 = local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar6 = 0x16;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!cmMakeRange(testData).empty()) failed on line ",
               0x3b);
  }
  else if ((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x28) {
    pbVar1 = (byte *)((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x14);
    if (pbVar1 == (byte *)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
      iVar6 = 0x19;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty()) failed on line ",0x46);
    }
    else if ((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar1 == 0x14) {
      if (pbVar1 == (byte *)((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish + -0x14)) {
        local_c8._0_8_ =
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
        local_c8._8_8_ =
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ::any_of<testRange(int,char**)::__0>();
        if (bVar4) {
          local_c8._0_8_ = piVar2;
          local_c8._8_8_ = piVar3;
          bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ::all_of<testRange(int,char**)::__1>();
          if (bVar4) {
            local_c8._0_8_ = piVar2;
            local_c8._8_8_ = piVar3;
            bVar4 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ::none_of<testRange(int,char**)::__2>();
            if (bVar4) {
              local_c8._0_8_ = (int *)0x400000002;
              local_c8._8_8_ = (int *)0x800000006;
              local_c8._16_4_ = 10;
              __l_00._M_len = 5;
              __l_00._M_array = (iterator)local_c8;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_f8,__l_00,(allocator_type *)&local_e0);
              for (local_c8._0_8_ =
                        local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
                  ((pointer)local_c8._0_8_ !=
                   local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish && ((*(byte *)local_c8._0_8_ & 1) != 0));
                  local_c8._0_8_ = local_c8._0_8_ + 4) {
              }
              local_c8._8_8_ =
                   local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_c8._24_8_ =
                   local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_a8._M_current =
                   local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
              bVar4 = operator==((cmRange<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>_>
                                  *)local_c8,
                                 (cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                  *)&local_e0);
              if (bVar4) {
                local_c8._0_8_ = local_c8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"1","");
                local_a8._M_current = (int *)local_98;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"2","");
                local_88[0] = local_78;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"3","");
                local_68[0] = local_58;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"4","");
                plVar8 = local_38;
                local_48[0] = plVar8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"5","");
                __l_01._M_len = 5;
                __l_01._M_array = (iterator)local_c8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_e0,__l_01,(allocator_type *)&local_28);
                lVar7 = -0xa0;
                do {
                  if (plVar8 != (long *)plVar8[-2]) {
                    operator_delete((long *)plVar8[-2],*plVar8 + 1);
                  }
                  plVar8 = plVar8 + -4;
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0);
                local_c8._16_8_ =
                     (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + -0x14;
                local_c8._0_8_ =
                     local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_28.Begin._M_current =
                     local_e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_28.End._M_current =
                     local_e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                bVar4 = operator==((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
                                    *)local_c8,&local_28);
                iVar6 = 0;
                if (!bVar4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(cmMakeRange(testData) .transform([](int n) { return std::to_string(n); }) .retreat(5) == cmMakeRange(stringRange)) failed on line "
                             ,0x8e);
                  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x2a);
                  iVar6 = -1;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_e0);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) == cmMakeRange(evenData)) failed on line "
                           ,0x74);
                poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x25);
                iVar6 = -1;
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              }
              if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              goto LAB_0017f76d;
            }
            iVar6 = 0x21;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; })) failed on line "
                       ,0x58);
          }
          else {
            iVar6 = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; })) failed on line "
                       ,0x57);
          }
        }
        else {
          iVar6 = 0x1f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; })) failed on line "
                     ,0x5b);
        }
      }
      else {
        iVar6 = 0x1c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty()) failed on line "
                   ,0x50);
      }
    }
    else {
      iVar6 = 0x1a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5) failed on line ",0x49);
    }
  }
  else {
    iVar6 = 0x17;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(cmMakeRange(testData).size() == 10) failed on line ",0x3f);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  iVar6 = -1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
LAB_0017f76d:
  if ((byte *)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int testRange(int /*unused*/, char* /*unused*/ [])
{
  std::vector<int> const testData = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10 };

  ASSERT_TRUE(!cmMakeRange(testData).empty());
  ASSERT_TRUE(cmMakeRange(testData).size() == 10);

  ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5);

  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).size() == 0);

  ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; }));
  ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; }));
  ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; }));

  std::vector<int> const evenData = { 2, 4, 6, 8, 10 };
  ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) ==
              cmMakeRange(evenData));

  std::vector<std::string> const stringRange = { "1", "2", "3", "4", "5" };
  ASSERT_TRUE(cmMakeRange(testData)
                .transform([](int n) { return std::to_string(n); })
                .retreat(5) == cmMakeRange(stringRange));

  return 0;
}